

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O3

int bf_hit(char *bf,char *line)

{
  bool bVar1;
  size_t len;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  uint hashv [2];
  uint local_20;
  uint local_1c;
  
  len = strlen(line);
  get_hashv(line,len,&local_20);
  bVar2 = false;
  puVar4 = &local_20;
  do {
    uVar3 = 1 << ((byte)*puVar4 & 7) & (uint)(byte)bf[*puVar4 >> 3];
    if (uVar3 == 0) break;
    bVar1 = !bVar2;
    bVar2 = true;
    puVar4 = &local_1c;
  } while (bVar1);
  return (int)(uVar3 != 0);
}

Assistant:

int bf_hit(char *bf, char *line)
{ unsigned i, hashv[NUM_HASHES];
  get_hashv(line,strlen(line),hashv);
  for(i=0; i<NUM_HASHES; i++)
  { if (BIT_TEST(bf,hashv[i])==0) return 0;
  }
  return 1;
}